

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall
Parser::parseFunctionDeclaration
          (Parser *this,Identifier *name,vector<Identifier,_std::allocator<Identifier>_> *parameters
          )

{
  bool bVar1;
  Token *pTVar2;
  Identifier *pIVar3;
  bool bVar4;
  bool local_51;
  Token *token;
  Token *first;
  vector<Identifier,_std::allocator<Identifier>_> *parameters_local;
  Identifier *name_local;
  Parser *this_local;
  
  pTVar2 = peekToken(this,0);
  if (pTVar2->type == Identifier) {
    pTVar2 = nextToken(this);
    pIVar3 = Token::identifierValue(pTVar2);
    Identifier::operator=(name,pIVar3);
    pTVar2 = nextToken(this);
    if (pTVar2->type == LParen) {
      std::vector<Identifier,_std::allocator<Identifier>_>::clear(parameters);
      while( true ) {
        bVar1 = atEnd(this);
        bVar4 = false;
        if (!bVar1) {
          pTVar2 = peekToken(this,0);
          bVar4 = pTVar2->type != RParen;
        }
        if (!bVar4) {
          bVar4 = atEnd(this);
          local_51 = false;
          if (!bVar4) {
            pTVar2 = nextToken(this);
            local_51 = pTVar2->type == RParen;
          }
          return local_51;
        }
        bVar4 = std::vector<Identifier,_std::allocator<Identifier>_>::empty(parameters);
        if ((!bVar4) && (pTVar2 = peekToken(this,0), pTVar2->type == Comma)) {
          eatToken(this);
        }
        pTVar2 = nextToken(this);
        if (pTVar2->type != Identifier) break;
        pIVar3 = Token::identifierValue(pTVar2);
        std::vector<Identifier,std::allocator<Identifier>>::emplace_back<Identifier_const&>
                  ((vector<Identifier,std::allocator<Identifier>> *)parameters,pIVar3);
      }
    }
  }
  return false;
}

Assistant:

bool Parser::parseFunctionDeclaration(Identifier& name, std::vector<Identifier> &parameters)
{
	const Token& first = peekToken();
	if (first.type != TokenType::Identifier)
		return false;

	name = nextToken().identifierValue();

	if (nextToken().type != TokenType::LParen)
		return false;

	parameters.clear();
	while (!atEnd() && peekToken().type != TokenType::RParen)
	{
		if (!parameters.empty() && peekToken().type == TokenType::Comma)
			eatToken();

		const Token& token = nextToken();
		if (token.type != TokenType::Identifier)
			return false;

		parameters.emplace_back(token.identifierValue());
	}

	return !atEnd() && nextToken().type == TokenType::RParen;
}